

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::ConcatenatingInputStream::Skip(ConcatenatingInputStream *this,int count)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Nullable<const_char_*> failure_msg;
  ulong uVar3;
  long lVar4;
  int iVar5;
  long local_48;
  LogMessageFatal local_40;
  
  uVar3 = (ulong)(uint)count;
  iVar5 = this->stream_count_;
  while (0 < iVar5) {
    iVar1 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    iVar2 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[4])(*this->streams_,uVar3);
    if ((char)iVar2 != '\0') break;
    lVar4 = CONCAT44(extraout_var,iVar1) + (long)(int)uVar3;
    iVar1 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    local_48 = lVar4;
    local_40.super_LogMessage._0_8_ = CONCAT44(extraout_var_00,iVar1);
    failure_msg = absl::lts_20250127::log_internal::Check_LTImpl<long,long>
                            ((long *)&local_40,&local_48,"final_byte_count < target_byte_count");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
                 ,0x145,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    this->bytes_retired_ = this->bytes_retired_ + CONCAT44(extraout_var_00,iVar1);
    this->streams_ = this->streams_ + 1;
    iVar5 = this->stream_count_ + -1;
    this->stream_count_ = iVar5;
    uVar3 = (ulong)(uint)((int)lVar4 - iVar1);
  }
  return 0 < iVar5;
}

Assistant:

bool ConcatenatingInputStream::Skip(int count) {
  while (stream_count_ > 0) {
    // Assume that ByteCount() can be used to find out how much we actually
    // skipped when Skip() fails.
    int64_t target_byte_count = streams_[0]->ByteCount() + count;
    if (streams_[0]->Skip(count)) return true;

    // Hit the end of the stream.  Figure out how many more bytes we still have
    // to skip.
    int64_t final_byte_count = streams_[0]->ByteCount();
    ABSL_DCHECK_LT(final_byte_count, target_byte_count);
    count = target_byte_count - final_byte_count;

    // That stream is done.  Advance to the next one.
    bytes_retired_ += final_byte_count;
    ++streams_;
    --stream_count_;
  }

  return false;
}